

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_ast_delete(mpc_ast_t *a)

{
  int local_14;
  int i;
  mpc_ast_t *a_local;
  
  if (a != (mpc_ast_t *)0x0) {
    for (local_14 = 0; local_14 < a->children_num; local_14 = local_14 + 1) {
      mpc_ast_delete(a->children[local_14]);
    }
    free(a->children);
    free(a->tag);
    free(a->contents);
    free(a);
  }
  return;
}

Assistant:

void mpc_ast_delete(mpc_ast_t *a) {

  int i;

  if (a == NULL) { return; }

  for (i = 0; i < a->children_num; i++) {
    mpc_ast_delete(a->children[i]);
  }

  free(a->children);
  free(a->tag);
  free(a->contents);
  free(a);

}